

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  _Ios_Openmode _Var3;
  ostream *poVar4;
  ulong uVar5;
  thread *ptVar6;
  char local_379;
  ulong uStack_378;
  char _C;
  size_t i_2;
  thread *local_368;
  thread *t_1;
  basic_ofstream<char,_std::char_traits<char>_> *pbStack_358;
  int i_1;
  thread *local_350;
  thread *t;
  string local_340 [8];
  string tfpath;
  int local_31c;
  undefined8 *puStack_318;
  int i;
  thread **threads;
  basic_ofstream<char,_std::char_traits<char>_> local_2f0 [8];
  ofstream ofile;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [8];
  string main_folder;
  string local_88 [8];
  string f;
  string local_68 [8];
  string key;
  string local_38 [8];
  string fpath;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_38);
  if (argc < 2) {
    std::mutex::lock(&mu);
    poVar4 = std::operator<<((ostream *)&std::cout,"[Output] You can open file(s) with this program"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::mutex::unlock(&mu);
    std::mutex::lock(&mu);
    poVar4 = std::operator<<((ostream *)&std::cout,"[Output] Or drag\'n\'drop on it");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::mutex::unlock(&mu);
    std::mutex::lock(&mu);
    std::operator<<((ostream *)&std::cout,"[Input] Enter filename(without spaces): ");
    std::mutex::unlock(&mu);
    std::operator>>((istream *)&std::cin,local_38);
  }
  else {
    std::__cxx11::string::assign((char *)local_38);
  }
  std::__cxx11::string::string(local_68);
  std::operator<<((ostream *)&std::cout,"[Input] Enter key(max 16 symbols): ");
  std::operator>>((istream *)&std::cin,local_68);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,pcVar1,&local_e9);
  getFileName(local_c8,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&threads,
                 (char *)local_a8);
  _Var3 = std::operator|(_S_out,_S_app);
  std::ofstream::ofstream(local_2f0,(string *)&threads,_Var3);
  std::__cxx11::string::~string((string *)&threads);
  poVar4 = std::operator<<((ostream *)&std::cout,"[Output] Logging into: ");
  poVar4 = std::operator<<(poVar4,"encoder.log");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (argc < 2) {
    puStack_318 = (undefined8 *)operator_new__(8);
    ptVar6 = (thread *)operator_new(8);
    i_2 = (size_t)local_2f0;
    std::thread::
    thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
              (ptVar6,encodeFile,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (basic_ofstream<char,_std::char_traits<char>_> **)&i_2);
    *puStack_318 = ptVar6;
    local_368 = ptVar6;
    std::thread::join();
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)(argc + -1);
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    puStack_318 = (undefined8 *)operator_new__(uVar5);
    for (local_31c = 0; local_31c < argc + -1; local_31c = local_31c + 1) {
      pcVar1 = argv[(long)local_31c + 1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,pcVar1,(allocator *)((long)&t + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&t + 7));
      ptVar6 = (thread *)operator_new(8);
      pbStack_358 = local_2f0;
      std::thread::
      thread<bool(&)(std::__cxx11::string,std::__cxx11::string,std::ofstream*),std::__cxx11::string&,std::__cxx11::string&,std::ofstream*,void>
                (ptVar6,encodeFile,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 &stack0xfffffffffffffca8);
      puStack_318[local_31c] = ptVar6;
      local_350 = ptVar6;
      std::__cxx11::string::~string(local_340);
    }
    for (t_1._4_4_ = 0; t_1._4_4_ < argc + -1; t_1._4_4_ = t_1._4_4_ + 1) {
      std::thread::join();
    }
  }
  for (uStack_378 = 0; uStack_378 < (ulong)(long)(argc + -1); uStack_378 = uStack_378 + 1) {
    ptVar6 = (thread *)puStack_318[uStack_378];
    if (ptVar6 != (thread *)0x0) {
      std::thread::~thread(ptVar6);
      operator_delete(ptVar6,8);
    }
  }
  if (puStack_318 != (undefined8 *)0x0) {
    operator_delete__(puStack_318);
  }
  std::ofstream::close();
  std::operator>>((istream *)&std::cin,&local_379);
  std::ofstream::~ofstream(local_2f0);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(const int argc, const char* argv[]) {
    //path
    std::string fpath;
    if (argc>1) {
        fpath.assign(argv[1]);
    } else {
        mu.lock(); std::cout << "[Output] You can open file(s) with this program" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Output] Or drag'n'drop on it" << std::endl; mu.unlock();
        mu.lock(); std::cout << "[Input] Enter filename(without spaces): "; mu.unlock();
        std::cin >> fpath;
    }

    //key reader
    std::string key;
    std::cout << "[Input] Enter key(max 16 symbols): ";
    std::cin >> key;
    std::cout << std::endl;

    std::string f, main_folder;
    getFileName(argv[0], &main_folder);
    std::ofstream ofile(main_folder+LOG_FILENAME, std::ios::out | std::ios::app);
    std::cout << "[Output] Logging into: " << LOG_FILENAME << std::endl;

    std::thread** threads;
    if (argc>1) {
        threads = new std::thread*[argc-1];
        for (int i=0; i<argc-1; i++) {
            std::string tfpath(argv[i+1]);
            std::thread* t  = new std::thread(encodeFile, tfpath, key, &ofile);
            threads[i] = t;
        }
        for (int i=0; i<argc-1; i++) {
            threads[i]->join();
        }
    } else {
        threads = new std::thread*[1];
        std::thread* t = new std::thread(encodeFile, fpath, key, &ofile);
        threads[0] = t;
        t->join();
    }

    for (size_t i=0; i<argc-1; i++) {
        delete threads[i];
    }
    delete[] threads;

    ofile.close();
    char _C; std::cin >> _C;            //breakpoint
    return 0;
}